

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * __thiscall
ON_FontList::FontFromQuartetProperties
          (ON_FontList *this,wchar_t *quartet_name,bool bBold,bool bItalic)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_ClassArray<ON_FontFaceQuartet> *this_00;
  ON_FontFaceQuartet *pOVar4;
  ON_Font *font;
  ON_FontFaceQuartet *q;
  int i;
  int quartet_list_count;
  ON_ClassArray<ON_FontFaceQuartet> *quartet_list;
  undefined1 local_58 [16];
  ON_FontFaceQuartet qname;
  bool bItalic_local;
  bool bBold_local;
  wchar_t *quartet_name_local;
  ON_FontList *this_local;
  
  qname.m_bold_italic._6_1_ = bItalic;
  qname.m_bold_italic._7_1_ = bBold;
  ON_FontFaceQuartet::ON_FontFaceQuartet
            ((ON_FontFaceQuartet *)(local_58 + 8),quartet_name,(ON_Font *)0x0,(ON_Font *)0x0,
             (ON_Font *)0x0,(ON_Font *)0x0);
  ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)local_58);
  bVar1 = ON_wString::IsEmpty((ON_wString *)local_58);
  ON_wString::~ON_wString((ON_wString *)local_58);
  if (bVar1) {
    this_local = (ON_FontList *)0x0;
  }
  else {
    this_00 = QuartetList(this);
    iVar2 = ON_ClassArray<ON_FontFaceQuartet>::Count(this_00);
    q._0_4_ = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                        (this_00,(ON_FontFaceQuartet *)(local_58 + 8),
                         ON_FontFaceQuartet::CompareQuartetName);
    if (((int)q < 0) || (iVar2 <= (int)q)) {
      this_local = (ON_FontList *)0x0;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (0 < (int)q) {
          pOVar4 = ON_ClassArray<ON_FontFaceQuartet>::operator[](this_00,(int)q + -1);
          iVar3 = ON_FontFaceQuartet::CompareQuartetName
                            ((ON_FontFaceQuartet *)(local_58 + 8),pOVar4);
          bVar1 = iVar3 == 0;
        }
        if (!bVar1) break;
        q._0_4_ = (int)q + -1;
      }
      do {
        pOVar4 = ON_ClassArray<ON_FontFaceQuartet>::operator[](this_00,(int)q);
        iVar3 = ON_FontFaceQuartet::CompareQuartetName((ON_FontFaceQuartet *)(local_58 + 8),pOVar4);
        if (iVar3 != 0) break;
        this_local = (ON_FontList *)
                     ON_FontFaceQuartet::Face
                               (pOVar4,(bool)(qname.m_bold_italic._7_1_ & 1),
                                (bool)(qname.m_bold_italic._6_1_ & 1));
        if (this_local != (ON_FontList *)0x0) goto LAB_0062c560;
        q._0_4_ = (int)q + 1;
      } while ((int)q < iVar2);
      this_local = (ON_FontList *)0x0;
    }
  }
LAB_0062c560:
  ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)(local_58 + 8));
  return (ON_Font *)this_local;
}

Assistant:

const ON_Font* ON_FontList::FontFromQuartetProperties(
  const wchar_t* quartet_name,
  bool bBold,
  bool bItalic
) const
{
  const ON_FontFaceQuartet qname(quartet_name, nullptr, nullptr, nullptr, nullptr);
  if (qname.QuartetName().IsEmpty())
    return nullptr;

  const ON_ClassArray< ON_FontFaceQuartet >& quartet_list = ON_FontList::QuartetList();
  const int quartet_list_count = quartet_list.Count();
  int i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);
  if (i < 0 || i >= quartet_list_count)
    return nullptr;

  while (i > 0 && 0 == ON_FontFaceQuartet::CompareQuartetName(&qname, &quartet_list[i - 1]))
    i--;
  
  do
  {
    const ON_FontFaceQuartet& q = quartet_list[i];
    if (0 != ON_FontFaceQuartet::CompareQuartetName(&qname, &q))
      break;
    const ON_Font* font = q.Face(bBold, bItalic);
    if (nullptr != font)
      return font;
    i++;
  } while (i < quartet_list_count);

  return nullptr;
}